

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O0

int GaussianOrder(ExpList *ijk)

{
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  runtime_error *this;
  difference_type dVar4;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> it;
  vector<int,_std::allocator<int>_> *v;
  int am;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff88;
  ExpList *in_stack_ffffffffffffff90;
  value_type_conflict vVar5;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffa0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffa8;
  map<int,_const_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_std::vector<int,_std::allocator<int>_>_>_>_>
  *in_stack_ffffffffffffffb0;
  
  pvVar3 = std::array<int,_3UL>::operator[]
                     (in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
  vVar5 = *pvVar3;
  pvVar3 = std::array<int,_3UL>::operator[]
                     (in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
  iVar2 = vVar5 + *pvVar3;
  std::array<int,_3UL>::operator[](in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
  std::
  map<int,_const_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_std::vector<int,_std::allocator<int>_>_>_>_>
  ::at(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8._M_current);
  std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff88);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff88);
  HashExpList(in_stack_ffffffffffffff90);
  __first = std::
            find<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>
                      (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                       (int *)CONCAT44(iVar2,vVar5));
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff88);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_ffffffffffffff90,
                     (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_ffffffffffffff88);
  if (!bVar1) {
    std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff88);
    __last._M_current._4_4_ = iVar2;
    __last._M_current._0_4_ = vVar5;
    dVar4 = std::
            distance<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                      (__first,__last);
    return (int)dVar4;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Gaussian not found in gindex_map");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int GaussianOrder(const ExpList & ijk)
{
    int am = ijk[0] + ijk[1] + ijk[2];

    const std::vector<int> & v = gindex_map.at(am);

    auto it = std::find(v.begin(), v.end(), HashExpList(ijk));
    if(it == v.end())
        throw std::runtime_error("Gaussian not found in gindex_map");

    return std::distance(v.begin(), it);

}